

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv2022.cpp
# Opt level: O2

void UConverter_fromUnicode_ISO_2022_JP_OFFSETS_LOGIC
               (UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  UChar UVar1;
  ushort uVar2;
  uint8_t *targetLimit;
  void *pvVar3;
  long lVar4;
  UChar *pUVar5;
  UErrorCode *pUVar6;
  byte bVar7;
  byte bVar8;
  int32_t iVar9;
  uint uVar10;
  int iVar11;
  uint8_t *puVar12;
  byte bVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  char cVar17;
  UChar *pUVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  long lVar23;
  UConverter *cnv;
  bool bVar24;
  uint local_dc;
  char buffer [8];
  uint local_bc;
  UErrorCode *local_b8;
  UConverterFromUnicodeArgs *local_b0;
  int *local_a8;
  uint8_t *local_a0;
  uint8_t *local_98;
  UConverter *local_90;
  UChar *local_88;
  ulong local_80;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  int8_t choices [10];
  
  cnv = args->converter;
  local_a0 = (uint8_t *)args->target;
  targetLimit = (uint8_t *)args->targetLimit;
  pUVar18 = args->source;
  local_88 = args->sourceLimit;
  local_a8 = args->offsets;
  pvVar3 = cnv->extraInfo;
  uVar21 = cnv->fromUChar32;
  local_dc = 0;
  uVar19 = 0;
  local_b8 = err;
  local_b0 = args;
  local_98 = local_a0;
  local_90 = cnv;
  if (uVar21 != 0 && local_a0 < targetLimit) goto LAB_002f41ca;
LAB_002f418a:
  do {
    if (local_88 <= pUVar18) {
LAB_002f4961:
      pUVar6 = local_b8;
      if ((*local_b8 < U_ILLEGAL_ARGUMENT_ERROR) &&
         ((((*(char *)((long)pvVar3 + 0x66) != '\0' || (*(char *)((long)pvVar3 + 0x62) != '\0')) &&
           (local_b0->flush != '\0')) && ((local_88 <= pUVar18 && (cnv->fromUChar32 == 0)))))) {
        bVar24 = *(char *)((long)pvVar3 + 0x66) != '\0';
        if (bVar24) {
          buffer[0] = '\x0f';
          *(undefined1 *)((long)pvVar3 + 0x66) = 0;
        }
        uVar21 = (uint)bVar24;
        if (*(char *)((long)pvVar3 + 0x62) != '\0') {
          buffer[(ulong)bVar24 + 2] = 'B';
          (buffer + bVar24)[0] = '\x1b';
          (buffer + bVar24)[1] = '(';
          uVar21 = uVar21 + 3;
          *(undefined1 *)((long)pvVar3 + 0x62) = 0;
        }
        pUVar5 = local_b0->source;
        iVar22 = (int)((ulong)((long)pUVar18 - (long)pUVar5) >> 1);
        if (iVar22 < 1) {
          uVar10 = 0xffffffff;
        }
        else {
          uVar10 = iVar22 - 1;
          if (((pUVar5[uVar10] & 0xfc00U) == 0xdc00) &&
             ((uVar10 == 0 || ((pUVar5[iVar22 - 2] & 0xfc00U) == 0xd800)))) {
            uVar10 = iVar22 - 2;
          }
        }
        fromUWriteUInt8(cnv,buffer,uVar21,&local_a0,(char *)targetLimit,&local_a8,uVar10,pUVar6);
      }
      goto LAB_002f49d0;
    }
    local_98 = local_a0;
    if (targetLimit <= local_a0) {
      *local_b8 = U_BUFFER_OVERFLOW_ERROR;
      goto LAB_002f49d0;
    }
    UVar1 = *pUVar18;
    uVar21 = (uint)(ushort)UVar1;
    pUVar18 = pUVar18 + 1;
    if ((uVar21 & 0xf800) == 0xd800) {
      if (((ushort)UVar1 >> 10 & 1) == 0) {
LAB_002f41ca:
        local_98 = local_a0;
        if (local_88 <= pUVar18) {
          cnv->fromUChar32 = uVar21;
          goto LAB_002f4961;
        }
        UVar1 = *pUVar18;
        if (((ushort)UVar1 & 0xfc00) == 0xdc00) {
          pUVar18 = pUVar18 + 1;
          uVar21 = uVar21 * 0x400 + (uint)(ushort)UVar1 + 0xfca02400;
          cnv->fromUChar32 = 0;
          goto LAB_002f4203;
        }
      }
LAB_002f494c:
      *local_b8 = U_ILLEGAL_CHAR_FOUND;
      cnv->fromUChar32 = uVar21;
      goto LAB_002f49d0;
    }
LAB_002f4203:
    local_a0 = local_98;
    if (((int)uVar21 < 0x20) && ((0x800c000U >> (uVar21 & 0x1f) & 1) != 0)) goto LAB_002f494c;
    if ((int)uVar19 == 0) {
      uVar2 = jpCharsetMasks[*(uint *)((long)pvVar3 + 0x6c)];
      bVar24 = *(uint *)((long)pvVar3 + 0x6c) - 3 < 2;
      if (bVar24) {
        choices[0] = '\b';
      }
      uVar14 = (uint)bVar24;
      bVar13 = *(byte *)((long)pvVar3 + 0x62);
      uVar20 = (ulong)uVar14;
      choices[uVar20] = bVar13;
      uVar19 = uVar20 + 1;
      uVar10 = (uint)uVar2 & ~(1 << (bVar13 & 0x1f)) & 0xfeff;
      bVar13 = *(byte *)((long)pvVar3 + 100);
      if (bVar13 != 0) {
        choices[uVar20 + 1] = bVar13;
        uVar10 = uVar10 & ~(1 << (bVar13 & 0x1f));
        uVar19 = (ulong)(uVar14 | 2);
      }
      for (lVar23 = 0; lVar23 != 0x24; lVar23 = lVar23 + 4) {
        bVar13 = (byte)*(uint *)((long)jpCharsetPref + lVar23);
        if ((uVar10 >> (*(uint *)((long)jpCharsetPref + lVar23) & 0x1f) & 1) != 0) {
          iVar22 = (int)uVar19;
          uVar19 = (ulong)(iVar22 + 1);
          choices[iVar22] = bVar13;
          uVar10 = uVar10 & ~(1 << (bVar13 & 0x1f));
        }
      }
    }
    cVar17 = cnv->useFallback;
    local_64 = uVar21 >> 4 & 0x3f;
    local_68 = uVar21 & 0xf;
    local_80 = (ulong)(uVar21 - 0xff61);
    local_70 = uVar21 - 0xfec0;
    local_74 = uVar21 - 0xff40;
    local_60 = uVar21 - 0xa0;
    local_6c = uVar21 - 0x80;
    lVar23 = 0;
    bVar13 = 0;
    bVar7 = 0;
    iVar22 = 0;
    while ((iVar9 = 1, lVar23 < (int)uVar19 && (iVar22 < 1))) {
      bVar8 = choices[lVar23];
      switch(bVar8) {
      case 0:
        if ((int)uVar21 < 0x80) {
          bVar13 = 0;
          local_dc = uVar21;
          goto LAB_002f461d;
        }
        break;
      case 1:
        if (local_60 < 0x60) {
          bVar7 = 2;
          bVar13 = 1;
          local_dc = local_6c;
          goto LAB_002f4625;
        }
        break;
      case 2:
        lVar4 = *(long *)((long)pvVar3 + 0x10);
        if (((int)uVar21 < 0x10000) || ((*(byte *)(lVar4 + 0xfd) & 1) != 0)) {
          uVar2 = *(ushort *)
                   (*(long *)(lVar4 + 0xe8) +
                   (ulong)(*(ushort *)
                            (*(long *)(lVar4 + 0x58) +
                            (ulong)(*(ushort *)
                                     (*(long *)(lVar4 + 0x58) + (long)((int)uVar21 >> 10) * 2) +
                                   local_64) * 2) + local_68) * 2);
          local_bc = (uint)(byte)uVar2;
          if (uVar2 < 0xf00) {
            iVar9 = -1;
            if (cVar17 == '\0') {
              if (0xbff < uVar2) goto LAB_002f4637;
              cVar17 = '\0';
            }
            else if (0x7ff < uVar2) goto LAB_002f4637;
          }
          else {
LAB_002f4637:
            if ((byte)uVar2 - 0xa0 < 0x60 && (iVar22 == 0 || 0xeff < uVar2)) {
              local_dc = local_bc - 0x80;
              cVar17 = '\0';
              bVar7 = 2;
              iVar22 = iVar9;
              bVar13 = 2;
            }
          }
        }
        break;
      case 3:
        if (uVar21 < 0x80) {
          if ((uVar21 == 0x5c) || (uVar21 == 0x7e)) break;
          bVar13 = 3;
          cVar17 = '\0';
          local_dc = uVar21;
        }
        else {
          if (uVar21 == 0xa5) {
            local_dc = 0x5c;
          }
          else {
            if (uVar21 != 0x203e) break;
            local_dc = 0x7e;
          }
          cVar17 = '\0';
          bVar13 = 3;
        }
LAB_002f461d:
        bVar7 = 0;
LAB_002f4625:
        iVar22 = 1;
        break;
      case 4:
        iVar9 = MBCS_FROM_UCHAR32_ISO2022
                          (*(UConverterSharedData **)((long)pvVar3 + 0x20),uVar21,&local_bc,cVar17,1
                          );
        if ((iVar9 == 2) || ((iVar9 == -2 && (iVar22 == 0)))) {
          if (local_bc < 0xeffd) {
            iVar22 = (uint)((local_bc & 0xff00) < 0x9f01) * 0x4000 + (local_bc & 0xff00);
            uVar14 = local_bc & 0xff;
            uVar10 = uVar14 < 0x7f | 0xffffffe0;
            local_dc = iVar22 * 2 - 0x16100;
            if (0x9e < uVar14) {
              uVar10 = 0xffffff82;
              local_dc = iVar22 * 2 - 0x16000;
            }
            local_dc = uVar10 + uVar14 | local_dc;
            bVar13 = 4;
LAB_002f453a:
            cVar17 = '\0';
            bVar7 = 0;
            iVar22 = iVar9;
          }
        }
        else if ((iVar22 == 0) && (cVar17 != '\0')) {
          iVar22 = 0;
          if ((uint)local_80 < 0x3f) {
            local_dc = (uint)hwkana_fb[local_80];
            cVar17 = '\0';
            bVar7 = 0;
            iVar22 = -2;
            bVar13 = 4;
          }
        }
        break;
      default:
        iVar9 = MBCS_FROM_UCHAR32_ISO2022
                          (*(UConverterSharedData **)((long)pvVar3 + (long)(char)bVar8 * 8),uVar21,
                           &local_bc,cVar17,1);
        if ((iVar9 == 2) || ((iVar9 == -2 && (iVar22 == 0)))) {
          if (bVar8 == 7) {
            if ((((local_bc + 0x5e5f & 0xfffe) < 0x5d5e) && ((local_bc + 0x5f & 0xfe) < 0x5e)) &&
               (local_bc - 0x8080 != 0)) {
              bVar13 = 7;
              local_dc = local_bc - 0x8080;
              goto LAB_002f453a;
            }
          }
          else {
            cVar17 = '\0';
            local_dc = local_bc;
            bVar7 = 0;
            iVar22 = iVar9;
            bVar13 = bVar8;
          }
        }
        break;
      case 8:
        if ((uint)local_80 < 0x3f) {
          if (*(int *)((long)pvVar3 + 0x6c) == 4) {
            bVar13 = *(byte *)((long)pvVar3 + 0x62);
            if ((*(byte *)((long)pvVar3 + 0x62) & 0xfc) == 4) {
              bVar13 = 3;
            }
            bVar7 = 0;
            local_dc = local_70;
          }
          else {
            if (*(int *)((long)pvVar3 + 0x6c) != 3) break;
            *(undefined1 *)((long)pvVar3 + 99) = 8;
            bVar7 = 1;
            bVar13 = 8;
            local_dc = local_74;
          }
          goto LAB_002f4625;
        }
      }
      lVar23 = lVar23 + 1;
    }
    if (iVar22 == 0) {
      *local_b8 = U_INVALID_CHAR_FOUND;
      local_90->fromUChar32 = uVar21;
      goto LAB_002f49d0;
    }
    iVar16 = -iVar22;
    if (0 < iVar22) {
      iVar16 = iVar22;
    }
    bVar8 = *(byte *)((long)pvVar3 + 0x66);
    bVar24 = bVar8 == 1 && bVar7 == 0;
    if (bVar24) {
      buffer[0] = '\x0f';
      *(undefined1 *)((long)pvVar3 + 0x66) = 0;
      bVar8 = 0;
    }
    uVar20 = (ulong)bVar24;
    if (bVar13 != *(byte *)((long)pvVar3 + (ulong)bVar7 + 0x62)) {
      cVar17 = "\x03\x03\x03\x03\x03\x04\x03\x04\x03"[(char)bVar13];
      memcpy(buffer + uVar20,escSeqChars + (char)bVar13,(long)cVar17);
      uVar20 = (ulong)((uint)bVar24 + (int)cVar17);
      *(byte *)((long)pvVar3 + (ulong)bVar7 + 0x62) = bVar13;
      bVar8 = *(byte *)((long)pvVar3 + 0x66);
      uVar19 = 0;
    }
    cnv = local_90;
    iVar11 = (int)uVar20;
    iVar22 = iVar11;
    if (bVar7 != bVar8) {
      iVar22 = iVar11 + 1;
      if (bVar7 == 1) {
        buffer[iVar11] = '\x0e';
        *(undefined1 *)((long)pvVar3 + 0x66) = 1;
      }
      else {
        buffer[iVar11] = '\x1b';
        iVar22 = iVar11 + 2;
        buffer[(long)iVar11 + 1] = 'N';
      }
    }
    iVar15 = 1;
    iVar11 = iVar22;
    if (iVar16 != 1) {
      iVar11 = iVar22 + 1;
      buffer[iVar22] = (char)(local_dc >> 8);
      iVar15 = 2;
    }
    iVar22 = iVar22 + iVar15;
    buffer[iVar11] = (char)local_dc;
    pUVar6 = local_b8;
    if ((uVar21 == 0xd) || (uVar21 == 10)) {
      *(undefined1 *)((long)pvVar3 + 100) = 0;
      uVar19 = 0;
    }
    if (iVar22 == 2) {
      puVar12 = local_98 + 2;
      if (puVar12 <= targetLimit) {
        *local_98 = buffer[0];
        local_98[1] = buffer[1];
        local_a0 = puVar12;
        if (local_a8 != (int *)0x0) {
          iVar22 = -1;
          if (0xffff < uVar21) {
            iVar22 = -2;
          }
          iVar22 = (int)((ulong)((long)pUVar18 - (long)local_b0->source) >> 1) + iVar22;
          *local_a8 = iVar22;
          local_a8[1] = iVar22;
          local_a8 = local_a8 + 2;
        }
        goto LAB_002f418a;
      }
    }
    else if (iVar22 == 1) {
      *local_98 = buffer[0];
      local_a0 = local_98 + 1;
      if (local_a8 != (int *)0x0) {
        *local_a8 = (int)((ulong)((long)pUVar18 - (long)local_b0->source) >> 1) + -1;
        local_a8 = local_a8 + 1;
      }
      goto LAB_002f418a;
    }
    iVar16 = -1;
    if (0xffff < uVar21) {
      iVar16 = -2;
    }
    fromUWriteUInt8(cnv,buffer,iVar22,&local_a0,(char *)targetLimit,&local_a8,
                    (int)((ulong)((long)pUVar18 - (long)local_b0->source) >> 1) + iVar16,local_b8);
    if (U_ZERO_ERROR < *pUVar6) {
LAB_002f49d0:
      local_b0->source = pUVar18;
      local_b0->target = (char *)local_a0;
      return;
    }
  } while( true );
}

Assistant:

static void U_CALLCONV
UConverter_fromUnicode_ISO_2022_JP_OFFSETS_LOGIC(UConverterFromUnicodeArgs* args, UErrorCode* err) {
    UConverter *cnv = args->converter;
    UConverterDataISO2022 *converterData;
    ISO2022State *pFromU2022State;
    uint8_t *target = (uint8_t *) args->target;
    const uint8_t *targetLimit = (const uint8_t *) args->targetLimit;
    const UChar* source = args->source;
    const UChar* sourceLimit = args->sourceLimit;
    int32_t* offsets = args->offsets;
    UChar32 sourceChar;
    char buffer[8];
    int32_t len, outLen;
    int8_t choices[10];
    int32_t choiceCount;
    uint32_t targetValue = 0;
    UBool useFallback;

    int32_t i;
    int8_t cs, g;

    /* set up the state */
    converterData     = (UConverterDataISO2022*)cnv->extraInfo;
    pFromU2022State   = &converterData->fromU2022State;

    choiceCount = 0;

    /* check if the last codepoint of previous buffer was a lead surrogate*/
    if((sourceChar = cnv->fromUChar32)!=0 && target< targetLimit) {
        goto getTrail;
    }

    while(source < sourceLimit) {
        if(target < targetLimit) {

            sourceChar  = *(source++);
            /*check if the char is a First surrogate*/
            if(U16_IS_SURROGATE(sourceChar)) {
                if(U16_IS_SURROGATE_LEAD(sourceChar)) {
getTrail:
                    /*look ahead to find the trail surrogate*/
                    if(source < sourceLimit) {
                        /* test the following code unit */
                        UChar trail=(UChar) *source;
                        if(U16_IS_TRAIL(trail)) {
                            source++;
                            sourceChar=U16_GET_SUPPLEMENTARY(sourceChar, trail);
                            cnv->fromUChar32=0x00;
                            /* convert this supplementary code point */
                            /* exit this condition tree */
                        } else {
                            /* this is an unmatched lead code unit (1st surrogate) */
                            /* callback(illegal) */
                            *err=U_ILLEGAL_CHAR_FOUND;
                            cnv->fromUChar32=sourceChar;
                            break;
                        }
                    } else {
                        /* no more input */
                        cnv->fromUChar32=sourceChar;
                        break;
                    }
                } else {
                    /* this is an unmatched trail code unit (2nd surrogate) */
                    /* callback(illegal) */
                    *err=U_ILLEGAL_CHAR_FOUND;
                    cnv->fromUChar32=sourceChar;
                    break;
                }
            }

            /* do not convert SO/SI/ESC */
            if(IS_2022_CONTROL(sourceChar)) {
                /* callback(illegal) */
                *err=U_ILLEGAL_CHAR_FOUND;
                cnv->fromUChar32=sourceChar;
                break;
            }

            /* do the conversion */

            if(choiceCount == 0) {
                uint16_t csm;

                /*
                 * The csm variable keeps track of which charsets are allowed
                 * and not used yet while building the choices[].
                 */
                csm = jpCharsetMasks[converterData->version];
                choiceCount = 0;

                /* JIS7/8: try single-byte half-width Katakana before JISX208 */
                if(converterData->version == 3 || converterData->version == 4) {
                    choices[choiceCount++] = (int8_t)HWKANA_7BIT;
                }
                /* Do not try single-byte half-width Katakana for other versions. */
                csm &= ~CSM(HWKANA_7BIT);

                /* try the current G0 charset */
                choices[choiceCount++] = cs = pFromU2022State->cs[0];
                csm &= ~CSM(cs);

                /* try the current G2 charset */
                if((cs = pFromU2022State->cs[2]) != 0) {
                    choices[choiceCount++] = cs;
                    csm &= ~CSM(cs);
                }

                /* try all the other possible charsets */
                for(i = 0; i < UPRV_LENGTHOF(jpCharsetPref); ++i) {
                    cs = (int8_t)jpCharsetPref[i];
                    if(CSM(cs) & csm) {
                        choices[choiceCount++] = cs;
                        csm &= ~CSM(cs);
                    }
                }
            }

            cs = g = 0;
            /*
             * len==0: no mapping found yet
             * len<0: found a fallback result: continue looking for a roundtrip but no further fallbacks
             * len>0: found a roundtrip result, done
             */
            len = 0;
            /*
             * We will turn off useFallback after finding a fallback,
             * but we still get fallbacks from PUA code points as usual.
             * Therefore, we will also need to check that we don't overwrite
             * an early fallback with a later one.
             */
            useFallback = cnv->useFallback;

            for(i = 0; i < choiceCount && len <= 0; ++i) {
                uint32_t value;
                int32_t len2;
                int8_t cs0 = choices[i];
                switch(cs0) {
                case ASCII:
                    if(sourceChar <= 0x7f) {
                        targetValue = (uint32_t)sourceChar;
                        len = 1;
                        cs = cs0;
                        g = 0;
                    }
                    break;
                case ISO8859_1:
                    if(GR96_START <= sourceChar && sourceChar <= GR96_END) {
                        targetValue = (uint32_t)sourceChar - 0x80;
                        len = 1;
                        cs = cs0;
                        g = 2;
                    }
                    break;
                case HWKANA_7BIT:
                    if((uint32_t)(sourceChar - HWKANA_START) <= (HWKANA_END - HWKANA_START)) {
                        if(converterData->version==3) {
                            /* JIS7: use G1 (SO) */
                            /* Shift U+FF61..U+FF9F to bytes 21..5F. */
                            targetValue = (uint32_t)(sourceChar - (HWKANA_START - 0x21));
                            len = 1;
                            pFromU2022State->cs[1] = cs = cs0; /* do not output an escape sequence */
                            g = 1;
                        } else if(converterData->version==4) {
                            /* JIS8: use 8-bit bytes with any single-byte charset, see escape sequence output below */
                            /* Shift U+FF61..U+FF9F to bytes A1..DF. */
                            targetValue = (uint32_t)(sourceChar - (HWKANA_START - 0xa1));
                            len = 1;

                            cs = pFromU2022State->cs[0];
                            if(IS_JP_DBCS(cs)) {
                                /* switch from a DBCS charset to JISX201 */
                                cs = (int8_t)JISX201;
                            }
                            /* else stay in the current G0 charset */
                            g = 0;
                        }
                        /* else do not use HWKANA_7BIT with other versions */
                    }
                    break;
                case JISX201:
                    /* G0 SBCS */
                    value = jisx201FromU(sourceChar);
                    if(value <= 0x7f) {
                        targetValue = value;
                        len = 1;
                        cs = cs0;
                        g = 0;
                        useFallback = FALSE;
                    }
                    break;
                case JISX208:
                    /* G0 DBCS from Shift-JIS table */
                    len2 = MBCS_FROM_UCHAR32_ISO2022(
                                converterData->myConverterArray[cs0],
                                sourceChar, &value,
                                useFallback, MBCS_OUTPUT_2);
                    if(len2 == 2 || (len2 == -2 && len == 0)) {  /* only accept DBCS: abs(len)==2 */
                        value = _2022FromSJIS(value);
                        if(value != 0) {
                            targetValue = value;
                            len = len2;
                            cs = cs0;
                            g = 0;
                            useFallback = FALSE;
                        }
                    } else if(len == 0 && useFallback &&
                              (uint32_t)(sourceChar - HWKANA_START) <= (HWKANA_END - HWKANA_START)) {
                        targetValue = hwkana_fb[sourceChar - HWKANA_START];
                        len = -2;
                        cs = cs0;
                        g = 0;
                        useFallback = FALSE;
                    }
                    break;
                case ISO8859_7:
                    /* G0 SBCS forced to 7-bit output */
                    len2 = MBCS_SINGLE_FROM_UCHAR32(
                                converterData->myConverterArray[cs0],
                                sourceChar, &value,
                                useFallback);
                    if(len2 != 0 && !(len2 < 0 && len != 0) && GR96_START <= value && value <= GR96_END) {
                        targetValue = value - 0x80;
                        len = len2;
                        cs = cs0;
                        g = 2;
                        useFallback = FALSE;
                    }
                    break;
                default:
                    /* G0 DBCS */
                    len2 = MBCS_FROM_UCHAR32_ISO2022(
                                converterData->myConverterArray[cs0],
                                sourceChar, &value,
                                useFallback, MBCS_OUTPUT_2);
                    if(len2 == 2 || (len2 == -2 && len == 0)) {  /* only accept DBCS: abs(len)==2 */
                        if(cs0 == KSC5601) {
                            /*
                             * Check for valid bytes for the encoding scheme.
                             * This is necessary because the sub-converter (windows-949)
                             * has a broader encoding scheme than is valid for 2022.
                             */
                            value = _2022FromGR94DBCS(value);
                            if(value == 0) {
                                break;
                            }
                        }
                        targetValue = value;
                        len = len2;
                        cs = cs0;
                        g = 0;
                        useFallback = FALSE;
                    }
                    break;
                }
            }

            if(len != 0) {
                if(len < 0) {
                    len = -len;  /* fallback */
                }
                outLen = 0; /* count output bytes */

                /* write SI if necessary (only for JIS7) */
                if(pFromU2022State->g == 1 && g == 0) {
                    buffer[outLen++] = UCNV_SI;
                    pFromU2022State->g = 0;
                }

                /* write the designation sequence if necessary */
                if(cs != pFromU2022State->cs[g]) {
                    int32_t escLen = escSeqCharsLen[cs];
                    uprv_memcpy(buffer + outLen, escSeqChars[cs], escLen);
                    outLen += escLen;
                    pFromU2022State->cs[g] = cs;

                    /* invalidate the choices[] */
                    choiceCount = 0;
                }

                /* write the shift sequence if necessary */
                if(g != pFromU2022State->g) {
                    switch(g) {
                    /* case 0 handled before writing escapes */
                    case 1:
                        buffer[outLen++] = UCNV_SO;
                        pFromU2022State->g = 1;
                        break;
                    default: /* case 2 */
                        buffer[outLen++] = 0x1b;
                        buffer[outLen++] = 0x4e;
                        break;
                    /* no case 3: no SS3 in ISO-2022-JP-x */
                    }
                }

                /* write the output bytes */
                if(len == 1) {
                    buffer[outLen++] = (char)targetValue;
                } else /* len == 2 */ {
                    buffer[outLen++] = (char)(targetValue >> 8);
                    buffer[outLen++] = (char)targetValue;
                }
            } else {
                /*
                 * if we cannot find the character after checking all codepages
                 * then this is an error
                 */
                *err = U_INVALID_CHAR_FOUND;
                cnv->fromUChar32=sourceChar;
                break;
            }

            if(sourceChar == CR || sourceChar == LF) {
                /* reset the G2 state at the end of a line (conversion got us into ASCII or JISX201 already) */
                pFromU2022State->cs[2] = 0;
                choiceCount = 0;
            }

            /* output outLen>0 bytes in buffer[] */
            if(outLen == 1) {
                *target++ = buffer[0];
                if(offsets) {
                    *offsets++ = (int32_t)(source - args->source - 1); /* -1: known to be ASCII */
                }
            } else if(outLen == 2 && (target + 2) <= targetLimit) {
                *target++ = buffer[0];
                *target++ = buffer[1];
                if(offsets) {
                    int32_t sourceIndex = (int32_t)(source - args->source - U16_LENGTH(sourceChar));
                    *offsets++ = sourceIndex;
                    *offsets++ = sourceIndex;
                }
            } else {
                fromUWriteUInt8(
                    cnv,
                    buffer, outLen,
                    &target, (const char *)targetLimit,
                    &offsets, (int32_t)(source - args->source - U16_LENGTH(sourceChar)),
                    err);
                if(U_FAILURE(*err)) {
                    break;
                }
            }
        } /* end if(myTargetIndex<myTargetLength) */
        else{
            *err =U_BUFFER_OVERFLOW_ERROR;
            break;
        }

    }/* end while(mySourceIndex<mySourceLength) */

    /*
     * the end of the input stream and detection of truncated input
     * are handled by the framework, but for ISO-2022-JP conversion
     * we need to be in ASCII mode at the very end
     *
     * conditions:
     *   successful
     *   in SO mode or not in ASCII mode
     *   end of input and no truncated input
     */
    if( U_SUCCESS(*err) &&
        (pFromU2022State->g!=0 || pFromU2022State->cs[0]!=ASCII) &&
        args->flush && source>=sourceLimit && cnv->fromUChar32==0
    ) {
        int32_t sourceIndex;

        outLen = 0;

        if(pFromU2022State->g != 0) {
            buffer[outLen++] = UCNV_SI;
            pFromU2022State->g = 0;
        }

        if(pFromU2022State->cs[0] != ASCII) {
            int32_t escLen = escSeqCharsLen[ASCII];
            uprv_memcpy(buffer + outLen, escSeqChars[ASCII], escLen);
            outLen += escLen;
            pFromU2022State->cs[0] = (int8_t)ASCII;
        }

        /* get the source index of the last input character */
        /*
         * TODO this would be simpler and more reliable if we used a pair
         * of sourceIndex/prevSourceIndex like in ucnvmbcs.c
         * so that we could simply use the prevSourceIndex here;
         * this code gives an incorrect result for the rare case of an unmatched
         * trail surrogate that is alone in the last buffer of the text stream
         */
        sourceIndex=(int32_t)(source-args->source);
        if(sourceIndex>0) {
            --sourceIndex;
            if( U16_IS_TRAIL(args->source[sourceIndex]) &&
                (sourceIndex==0 || U16_IS_LEAD(args->source[sourceIndex-1]))
            ) {
                --sourceIndex;
            }
        } else {
            sourceIndex=-1;
        }

        fromUWriteUInt8(
            cnv,
            buffer, outLen,
            &target, (const char *)targetLimit,
            &offsets, sourceIndex,
            err);
    }

    /*save the state and return */
    args->source = source;
    args->target = (char*)target;
}